

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_Quit(void)

{
  GPU_DebugLevelEnum GVar1;
  char *pcVar2;
  
  if ((_gpu_num_error_codes != 0) && (GVar1 = GPU_GetDebugLevel(), GVar1 != GPU_DEBUG_LEVEL_0)) {
    pcVar2 = "";
    if (1 < _gpu_num_error_codes) {
      pcVar2 = "s";
    }
    GPU_LogError("GPU_Quit: %d uncleared error%s.\n",(ulong)_gpu_num_error_codes,pcVar2);
  }
  gpu_free_error_queue();
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    (*_gpu_current_renderer->impl->Quit)(_gpu_current_renderer);
    GPU_FreeRenderer(_gpu_current_renderer);
    _gpu_current_renderer = (GPU_Renderer *)0x0;
    _gpu_init_windowID = 0;
    SDL_free(_gpu_window_mappings);
    _gpu_window_mappings = (GPU_WindowMapping *)0x0;
    _gpu_window_mappings_size = 0;
    _gpu_num_window_mappings = 0;
    gpu_free_renderer_register();
    if ((_gpu_initialized_SDL & 1U) != 0) {
      SDL_QuitSubSystem(0x20);
      _gpu_initialized_SDL = false;
      if ((_gpu_initialized_SDL_core & 1U) != 0) {
        SDL_Quit();
        _gpu_initialized_SDL_core = false;
      }
    }
  }
  return;
}

Assistant:

void GPU_Quit(void)
{
    if(_gpu_num_error_codes > 0 && GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_1)
        GPU_LogError("GPU_Quit: %d uncleared error%s.\n", _gpu_num_error_codes, (_gpu_num_error_codes > 1? "s" : ""));

    gpu_free_error_queue();

    if(_gpu_current_renderer == NULL)
        return;

    _gpu_current_renderer->impl->Quit(_gpu_current_renderer);
    GPU_FreeRenderer(_gpu_current_renderer);
    // FIXME: Free all renderers
    _gpu_current_renderer = NULL;

    _gpu_init_windowID = 0;

    // Free window mappings
    SDL_free(_gpu_window_mappings);
    _gpu_window_mappings = NULL;
    _gpu_window_mappings_size = 0;
    _gpu_num_window_mappings = 0;

    gpu_free_renderer_register();

    if(_gpu_initialized_SDL)
    {
        SDL_QuitSubSystem(SDL_INIT_VIDEO);
        _gpu_initialized_SDL = 0;

        if(_gpu_initialized_SDL_core)
        {
            SDL_Quit();
            _gpu_initialized_SDL_core = 0;
        }
    }
}